

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

GenerateBlockArraySymbol *
slang::ast::GenerateBlockArraySymbol::fromSyntax
          (Compilation *comp,LoopGenerateSyntax *syntax,SymbolIndex scopeIndex,ASTContext *context,
          uint32_t constructIndex)

{
  SourceLocation noteLocation;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  string_view arg;
  SourceRange assignmentRange;
  string_view name_00;
  bool bVar1;
  int iVar3;
  CompilationOptions *pCVar4;
  undefined1 uVar2;
  ExpressionSyntax *pEVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ConstantValue *pCVar6;
  SVInt *pSVar7;
  iterator pSVar8;
  iterator ppGVar9;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_01;
  span<const_slang::ast::GenerateBlockSymbol_*const,_18446744073709551615UL> *this;
  SyntaxNode *in_RSI;
  Compilation *in_RDI;
  LookupLocation LVar10;
  SourceRange SVar11;
  SourceRange SVar12;
  GenerateBlockSymbol *entry;
  iterator __end3_1;
  iterator __begin3_1;
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> *__range3_1;
  SVInt *index;
  iterator __end3;
  iterator __begin3;
  SmallVector<slang::SVInt,_8UL> *__range3;
  bool isUninstantiated;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  pair;
  ConstantValue stop;
  SmallVector<slang::SVInt,_8UL> indices;
  SmallSet<slang::SVInt,_8UL,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
  usedValues;
  uint64_t loopCount;
  ConstantValue *loopVal;
  EvalContext evalContext;
  Expression *iterExpr;
  Expression *stopExpr;
  ASTContext iterContext;
  VariableSymbol *local;
  StatementBlockSymbol *iterScope;
  ConstantValue initialVal;
  Expression *initial;
  anon_class_48_6_985204b5 createBlock;
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> entries;
  GenvarSymbol *genvarSymbol;
  Diagnostic *diag;
  Symbol *symbol;
  uint64_t loopLimit;
  uint64_t baseCount;
  IdentifierNameSyntax *genvarSyntax;
  Token genvar;
  GenerateBlockArraySymbol *result;
  type *loc;
  type *name;
  locator loc_1;
  size_t pos0;
  size_t hash;
  SVInt *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  SourceLocation in_stack_fffffffffffff318;
  SourceLocation in_stack_fffffffffffff320;
  undefined4 in_stack_fffffffffffff328;
  bitwidth_t in_stack_fffffffffffff32c;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff330;
  DiagCode DVar13;
  span<const_slang::ast::GenerateBlockSymbol_*const,_18446744073709551615UL> *this_00;
  ASTContext *in_stack_fffffffffffff338;
  undefined7 in_stack_fffffffffffff340;
  undefined1 in_stack_fffffffffffff347;
  SourceLocation in_stack_fffffffffffff348;
  Diagnostic *in_stack_fffffffffffff350;
  SourceLocation in_stack_fffffffffffff358;
  undefined7 in_stack_fffffffffffff360;
  bitmask<slang::ast::EvalFlags> in_stack_fffffffffffff367;
  undefined7 in_stack_fffffffffffff368;
  undefined1 in_stack_fffffffffffff36f;
  BumpAllocator *in_stack_fffffffffffff370;
  EvalContext *in_stack_fffffffffffff380;
  SourceLocation in_stack_fffffffffffff388;
  SourceLocation in_stack_fffffffffffff390;
  Expression *in_stack_fffffffffffff3a0;
  ASTContext *in_stack_fffffffffffff3a8;
  ASTContext *in_stack_fffffffffffff3c0;
  undefined1 *puVar14;
  ExpressionSyntax *in_stack_fffffffffffff3c8;
  Type *in_stack_fffffffffffff3d0;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff3d8;
  undefined1 *puVar15;
  SourceLocation in_stack_fffffffffffff3e0;
  SourceLocation in_stack_fffffffffffff3e8;
  SVInt *in_stack_fffffffffffff3f0;
  undefined1 isUninstantiated_00;
  ConstantValue *in_stack_fffffffffffff3f8;
  undefined5 in_stack_fffffffffffff400;
  undefined1 in_stack_fffffffffffff405;
  undefined1 in_stack_fffffffffffff406;
  iterator local_a90;
  pointer local_a38;
  size_t local_a30;
  iterator local_9f0;
  Scope *in_stack_fffffffffffff668;
  bitmask<slang::ast::LookupFlags> in_stack_fffffffffffff674;
  LookupLocation in_stack_fffffffffffff678;
  size_t in_stack_fffffffffffff688;
  char *in_stack_fffffffffffff690;
  table_element_pointer in_stack_fffffffffffff6b0;
  bool in_stack_fffffffffffff6b8;
  undefined7 in_stack_fffffffffffff6b9;
  ASTContext *in_stack_fffffffffffff6c0;
  bitmask<slang::ast::EvalFlags> in_stack_fffffffffffff6cf;
  SmallVectorBase<slang::SVInt> local_900 [7];
  undefined1 local_7e0 [56];
  ulong local_7a8;
  SourceRange local_7a0;
  undefined4 local_78c;
  ConstantValue *local_760;
  bitmask<slang::ast::EvalFlags> local_751 [849];
  bitmask<slang::ast::ASTFlags> local_400;
  undefined8 local_3f8;
  bitmask<slang::ast::ASTFlags> local_3f0;
  undefined8 local_3e8;
  bitmask<slang::ast::ASTFlags> local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  sockaddr local_3c0 [3];
  bitmask<slang::ast::VariableFlags> local_386;
  undefined4 local_384;
  SourceLocation local_380;
  string_view local_378;
  VariableSymbol *local_368;
  undefined4 local_360;
  undefined4 local_35c;
  StatementBlockSymbol *local_358;
  int local_350;
  bitmask<slang::ast::EvalFlags> local_349 [41];
  bitmask<slang::ast::ASTFlags> local_320;
  SourceRange local_318;
  Expression *local_2f8;
  type local_2f0;
  Compilation *local_2e8;
  SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*> *local_2e0;
  SyntaxNode **local_2d8;
  IdentifierNameSyntax **local_2d0;
  SyntaxNode *local_2c8;
  SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*> local_2c0 [2];
  SourceLocation local_280;
  string_view local_278;
  Symbol *local_268;
  SourceLocation local_260;
  undefined4 local_254;
  string_view local_250;
  SourceRange local_240;
  undefined4 local_22c;
  Diagnostic *local_228;
  bitmask<slang::ast::LookupFlags> local_21c;
  SourceRange local_218;
  Scope *local_208;
  uint32_t local_200;
  Scope *local_1f8;
  uint32_t local_1f0;
  string_view local_1e8;
  Symbol *local_1d8;
  ulong local_1d0;
  uint64_t local_1c8;
  IdentifierNameSyntax *local_1c0;
  Token local_1b8 [2];
  GenerateBlockArraySymbol *local_198;
  type *local_190;
  type *local_188;
  SyntaxNode *local_150;
  Compilation *local_148;
  GenerateBlockArraySymbol *local_140;
  SVInt *local_138;
  undefined1 *local_130;
  SVInt *local_128;
  undefined1 *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::SVInt>
  local_a0;
  size_t local_88;
  size_t local_80;
  SVInt *local_78;
  SVInt *local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  SVInt *local_10;
  undefined1 *local_8;
  
  local_150 = in_RSI;
  local_148 = in_RDI;
  not_null<slang::syntax::MemberSyntax_*>::operator*
            ((not_null<slang::syntax::MemberSyntax_*> *)0x3eaa52);
  getGenerateBlockName((SyntaxNode *)in_stack_fffffffffffff3a0);
  local_188 = std::
              get<0ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                        ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                          *)0x3eaa6f);
  local_190 = std::
              get<1ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                        ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                          *)0x3eaa84);
  local_198 = BumpAllocator::
              emplace<slang::ast::GenerateBlockArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&>
                        ((BumpAllocator *)in_stack_fffffffffffff350,
                         (Compilation *)in_stack_fffffffffffff348,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340),
                         (SourceLocation *)in_stack_fffffffffffff338,
                         (uint *)in_stack_fffffffffffff330.m_bits);
  Symbol::setSyntax(&local_198->super_Symbol,local_150);
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x3eaaf3);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffff330.m_bits,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  syntax_00._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff360;
  syntax_00._M_ptr = (pointer)in_stack_fffffffffffff358;
  syntax_00._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff367.m_bits;
  Symbol::setAttributes
            ((Symbol *)in_stack_fffffffffffff350,(Scope *)in_stack_fffffffffffff348,syntax_00);
  local_1b8[0]._0_8_ = local_150[5].parent;
  local_1b8[0].info = (Info *)local_150[5].previewNode;
  bVar1 = parsing::Token::isMissing(local_1b8);
  if (bVar1) {
    return local_198;
  }
  local_1c0 = BumpAllocator::emplace<slang::syntax::IdentifierNameSyntax,slang::parsing::Token&>
                        ((BumpAllocator *)in_stack_fffffffffffff330.m_bits,
                         (Token *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x3eabb1);
  local_1c8 = getGenerateLoopCount
                        ((Scope *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
  pCVar4 = Compilation::getOptions(local_148);
  local_1d0 = (ulong)pCVar4->maxGenerateSteps;
  bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x3eabea);
  if (bVar1) {
    local_278 = parsing::Token::valueText((Token *)in_stack_fffffffffffff330.m_bits);
    local_280 = parsing::Token::location(local_1b8);
    local_268 = &BumpAllocator::
                 emplace<slang::ast::GenvarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                           ((BumpAllocator *)
                            CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340),
                            (basic_string_view<char,_std::char_traits<char>_> *)
                            in_stack_fffffffffffff338,
                            (SourceLocation *)in_stack_fffffffffffff330.m_bits)->super_Symbol;
    Symbol::setSyntax(local_268,(SyntaxNode *)local_1c0);
    Scope::addMember((Scope *)in_stack_fffffffffffff320,(Symbol *)in_stack_fffffffffffff318);
  }
  else {
    not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x3eabff);
    local_1e8 = parsing::Token::valueText((Token *)in_stack_fffffffffffff330.m_bits);
    LVar10 = ASTContext::getLocation((ASTContext *)in_stack_fffffffffffff320);
    local_208 = LVar10.scope;
    local_200 = LVar10.index;
    local_1f8 = local_208;
    local_1f0 = local_200;
    local_218 = parsing::Token::range
                          ((Token *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    bitmask<slang::ast::LookupFlags>::bitmask(&local_21c,None);
    name_00._M_str = in_stack_fffffffffffff690;
    name_00._M_len = in_stack_fffffffffffff688;
    SVar12.endLoc._0_1_ = in_stack_fffffffffffff6b8;
    SVar12.startLoc = (SourceLocation)in_stack_fffffffffffff6b0;
    SVar12.endLoc._1_7_ = in_stack_fffffffffffff6b9;
    in_stack_fffffffffffff318 = local_218.startLoc;
    in_stack_fffffffffffff320 = local_218.endLoc;
    local_1d8 = Lookup::unqualifiedAt
                          (in_stack_fffffffffffff668,name_00,in_stack_fffffffffffff678,SVar12,
                           in_stack_fffffffffffff674);
    if (local_1d8 == (Symbol *)0x0) {
      return local_198;
    }
    if (local_1d8->kind != Genvar) {
      local_22c = 0x20000a;
      local_240 = parsing::Token::range
                            ((Token *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340))
      ;
      sourceRange.startLoc._7_1_ = in_stack_fffffffffffff347;
      sourceRange.startLoc._0_7_ = in_stack_fffffffffffff340;
      sourceRange.endLoc = in_stack_fffffffffffff348;
      local_228 = ASTContext::addDiag(in_stack_fffffffffffff338,
                                      SUB84((ulong)in_stack_fffffffffffff350 >> 0x20,0),sourceRange)
      ;
      local_250 = parsing::Token::valueText((Token *)in_stack_fffffffffffff330.m_bits);
      DVar13 = SUB84(in_stack_fffffffffffff330.m_bits >> 0x20,0);
      arg._M_len._7_1_ = in_stack_fffffffffffff36f;
      arg._M_len._0_7_ = in_stack_fffffffffffff368;
      arg._M_str = (char *)in_stack_fffffffffffff370;
      Diagnostic::operator<<
                ((Diagnostic *)CONCAT17(in_stack_fffffffffffff367.m_bits,in_stack_fffffffffffff360),
                 arg);
      local_254 = 0x50001;
      local_260 = local_1d8->location;
      noteLocation._4_4_ = in_stack_fffffffffffff32c;
      noteLocation._0_4_ = in_stack_fffffffffffff328;
      Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff320,DVar13,noteLocation);
      return local_198;
    }
    Compilation::noteReference
              ((Compilation *)in_stack_fffffffffffff330.m_bits,
               (Symbol *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328),
               in_stack_fffffffffffff320._7_1_);
  }
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> *)0x3eaed8);
  local_2f0 = *local_190;
  local_2e8 = local_148;
  local_2d8 = (SyntaxNode **)local_1b8;
  local_2d0 = &local_1c0;
  local_2c8 = local_150;
  local_2e0 = local_2c0;
  Compilation::getIntegerType(local_148);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x3eaf66);
  local_318 = parsing::Token::range
                        ((Token *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
  bitmask<slang::ast::ASTFlags>::bitmask(&local_320,None);
  assignmentRange.endLoc = in_stack_fffffffffffff3e8;
  assignmentRange.startLoc = in_stack_fffffffffffff3e0;
  local_2f8 = Expression::bindRValue
                        (in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,assignmentRange,
                         in_stack_fffffffffffff3c0,in_stack_fffffffffffff3d8);
  local_349[0].m_bits = '\0';
  bitmask<slang::ast::EvalFlags>::bitmask(local_349);
  ASTContext::eval(in_stack_fffffffffffff6c0,
                   (Expression *)CONCAT71(in_stack_fffffffffffff6b9,in_stack_fffffffffffff6b8),
                   in_stack_fffffffffffff6cf);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x3eb08f);
  if (bVar1) {
    local_35c = 0;
    local_360 = 0;
    local_358 = BumpAllocator::
                emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation&,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                          (in_stack_fffffffffffff370,
                           (Compilation *)
                           CONCAT17(in_stack_fffffffffffff36f,in_stack_fffffffffffff368),
                           (char (*) [1])
                           CONCAT17(in_stack_fffffffffffff367.m_bits,in_stack_fffffffffffff360),
                           (SourceLocation *)in_stack_fffffffffffff358,
                           (StatementBlockKind *)in_stack_fffffffffffff350,
                           (VariableLifetime *)in_stack_fffffffffffff348);
    local_378 = parsing::Token::valueText((Token *)in_stack_fffffffffffff330.m_bits);
    local_380 = parsing::Token::location(local_1b8);
    local_384 = 0;
    local_368 = BumpAllocator::
                emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime>
                          ((BumpAllocator *)in_stack_fffffffffffff350,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff348,
                           (SourceLocation *)
                           CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340),
                           (VariableLifetime *)in_stack_fffffffffffff338);
    Compilation::getIntegerType(local_148);
    ValueSymbol::setType((ValueSymbol *)in_stack_fffffffffffff320,(Type *)in_stack_fffffffffffff318)
    ;
    bitmask<slang::ast::VariableFlags>::bitmask(&local_386,CompilerGenerated);
    bitmask<slang::ast::VariableFlags>::operator|=(&local_368->flags,&local_386);
    not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x3eb2a7);
    StatementBlockSymbol::setTemporaryParent
              ((StatementBlockSymbol *)in_stack_fffffffffffff320,(Scope *)in_stack_fffffffffffff318,
               0);
    Scope::addMember((Scope *)in_stack_fffffffffffff320,(Symbol *)in_stack_fffffffffffff318);
    local_3d8 = LookupLocation::max;
    uStack_3d0 = DAT_00e65180;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_3e0,None);
    LVar10._8_7_ = in_stack_fffffffffffff340;
    LVar10.scope = (Scope *)in_stack_fffffffffffff338;
    LVar10._15_1_ = in_stack_fffffffffffff347;
    ASTContext::ASTContext
              ((ASTContext *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328),
               (Scope *)in_stack_fffffffffffff320,LVar10,in_stack_fffffffffffff330);
    pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0x3eb363);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_3f0,None);
    iVar3 = Expression::bind((int)pEVar5,local_3c0,(socklen_t)local_3f0.m_bits);
    local_3e8 = CONCAT44(extraout_var,iVar3);
    pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0x3eb3c9);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_400,AssignmentAllowed);
    iVar3 = Expression::bind((int)pEVar5,local_3c0,(socklen_t)local_400.m_bits);
    local_3f8 = CONCAT44(extraout_var_00,iVar3);
    bVar1 = Expression::bad((Expression *)in_stack_fffffffffffff320);
    if (!bVar1) {
      bVar1 = Expression::bad((Expression *)in_stack_fffffffffffff320);
      if (!bVar1) {
        bVar1 = ASTContext::requireBooleanConvertible
                          (in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
        if (bVar1) {
          local_751[0].m_bits = '\0';
          bitmask<slang::ast::EvalFlags>::bitmask(local_751);
          EvalContext::EvalContext
                    ((EvalContext *)in_stack_fffffffffffff358,
                     (ASTContext *)in_stack_fffffffffffff350,in_stack_fffffffffffff367);
          EvalContext::pushEmptyFrame(in_stack_fffffffffffff380);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffff320,
                     (ConstantValue *)in_stack_fffffffffffff318);
          pCVar6 = EvalContext::createLocal
                             ((EvalContext *)
                              CONCAT17(in_stack_fffffffffffff367.m_bits,in_stack_fffffffffffff360),
                              (ValueSymbol *)in_stack_fffffffffffff358,
                              (ConstantValue *)in_stack_fffffffffffff350);
          slang::ConstantValue::~ConstantValue((ConstantValue *)0x3eb56b);
          local_760 = pCVar6;
          pSVar7 = slang::ConstantValue::integer((ConstantValue *)0x3eb588);
          bVar1 = SVInt::hasUnknown(pSVar7);
          if (bVar1) {
            local_78c = 0x3e0006;
            local_7a0 = parsing::Token::range
                                  ((Token *)CONCAT17(in_stack_fffffffffffff347,
                                                     in_stack_fffffffffffff340));
            sourceRange_00.startLoc._7_1_ = in_stack_fffffffffffff347;
            sourceRange_00.startLoc._0_7_ = in_stack_fffffffffffff340;
            sourceRange_00.endLoc = in_stack_fffffffffffff348;
            ASTContext::addDiag(in_stack_fffffffffffff338,
                                SUB84((ulong)in_stack_fffffffffffff350 >> 0x20,0),sourceRange_00);
            Diagnostic::operator<<
                      ((Diagnostic *)in_stack_fffffffffffff320,
                       (ConstantValue *)in_stack_fffffffffffff318);
          }
          local_7a8 = 0;
          SmallSet<slang::SVInt,_8UL,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
          ::SmallSet((SmallSet<slang::SVInt,_8UL,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                      *)in_stack_fffffffffffff330.m_bits);
          SmallVector<slang::SVInt,_8UL>::SmallVector((SmallVector<slang::SVInt,_8UL> *)0x3eb6b0);
          SVar11.endLoc = in_stack_fffffffffffff388;
          SVar11.startLoc = in_stack_fffffffffffff390;
          do {
            DVar13 = SUB84((ulong)in_stack_fffffffffffff350 >> 0x20,0);
            local_7a8 = local_1c8 + local_7a8;
            if (local_1d0 < local_7a8) {
              parsing::Token::range
                        ((Token *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
              sourceRange_01.startLoc._7_1_ = in_stack_fffffffffffff347;
              sourceRange_01.startLoc._0_7_ = in_stack_fffffffffffff340;
              sourceRange_01.endLoc = in_stack_fffffffffffff348;
              ASTContext::addDiag(in_stack_fffffffffffff338,DVar13,sourceRange_01);
              goto LAB_003ec31d;
            }
            Expression::eval((Expression *)
                             CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328),
                             (EvalContext *)in_stack_fffffffffffff320);
            uVar2 = slang::ConstantValue::bad((ConstantValue *)0x3eb7c9);
            if ((bool)uVar2) {
LAB_003eb802:
              in_stack_fffffffffffff405 = slang::ConstantValue::bad((ConstantValue *)0x3eb80f);
              local_198->valid = (bool)((in_stack_fffffffffffff405 ^ 0xff) & 1);
              local_350 = 3;
            }
            else {
              in_stack_fffffffffffff406 =
                   slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffff320);
              if (!(bool)in_stack_fffffffffffff406) goto LAB_003eb802;
              in_stack_fffffffffffff3f8 =
                   (ConstantValue *)slang::ConstantValue::integer((ConstantValue *)0x3eb869);
              SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt&>
                        ((SmallVectorBase<slang::SVInt> *)
                         CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328),
                         (SVInt *)in_stack_fffffffffffff320);
              puVar14 = local_7e0;
              in_stack_fffffffffffff3f0 = slang::ConstantValue::integer((ConstantValue *)0x3eb8a7);
              local_138 = in_stack_fffffffffffff3f0;
              local_130 = puVar14;
              local_128 = in_stack_fffffffffffff3f0;
              local_120 = puVar14;
              local_70 = in_stack_fffffffffffff3f0;
              local_68 = puVar14;
              local_78 = boost::unordered::detail::foa::
                         table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                         ::key_from<slang::SVInt>((SVInt *)0x3eb92e);
              local_80 = boost::unordered::detail::foa::
                         table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                         ::hash_for<slang::SVInt>
                                   ((table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                                     *)in_stack_fffffffffffff320,(SVInt *)in_stack_fffffffffffff318)
              ;
              local_88 = boost::unordered::detail::foa::
                         table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                         ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                                         *)in_stack_fffffffffffff320,
                                        (size_t)in_stack_fffffffffffff318);
              local_10 = local_78;
              local_20 = local_80;
              puVar15 = puVar14;
              local_18 = local_88;
              local_8 = puVar14;
              boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                        (&local_30,local_88);
              do {
                local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
                local_40 = boost::unordered::detail::foa::
                           table_arrays<slang::SVInt,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                           ::groups((table_arrays<slang::SVInt,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                                     *)0x3eba31);
                local_40 = local_40 + local_38;
                local_44 = boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::match
                                     ((group15<boost::unordered::detail::foa::plain_integral> *)
                                      CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328),
                                      (size_t)in_stack_fffffffffffff320);
                if (local_44 != 0) {
                  local_50 = boost::unordered::detail::foa::
                             table_arrays<slang::SVInt,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                             ::elements((table_arrays<slang::SVInt,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                                         *)0x3eba93);
                  local_58 = local_50 + local_38 * 0xf;
                  do {
                    local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                    ::pred((table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                            *)0x3ebae6);
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                    ::key_from<slang::SVInt>((SVInt *)0x3ebb19);
                    bVar1 = std::equal_to<slang::SVInt>::operator()
                                      ((equal_to<slang::SVInt> *)in_stack_fffffffffffff320,
                                       (SVInt *)in_stack_fffffffffffff318,(SVInt *)0x3ebb40);
                    if (bVar1) {
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::SVInt>
                      ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
                      goto LAB_003ebc45;
                    }
                    local_44 = local_44 - 1 & local_44;
                  } while (local_44 != 0);
                }
                bVar1 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_fffffffffffff320,(size_t)in_stack_fffffffffffff318);
                if (bVar1) {
                  memset(&local_a0,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::SVInt>
                  ::table_locator(&local_a0);
                  goto LAB_003ebc45;
                }
                bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                  (&local_30,*(size_t *)(puVar14 + 0x10));
              } while (bVar1);
              memset(&local_a0,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::SVInt>
              ::table_locator(&local_a0);
LAB_003ebc45:
              bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                ((table_locator *)&local_a0);
              if (bVar1) {
                local_b0 = boost::unordered::detail::foa::
                           table<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                           ::make_iterator((locator *)0x3ebc67);
                local_b1 = false;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                            *)&stack0xfffffffffffff6a8,&local_b0,&local_b1);
              }
              else if (*(ulong *)(puVar15 + 0x30) < *(ulong *)(puVar15 + 0x28)) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
                ::unchecked_emplace_at<slang::SVInt&>
                          ((table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                            *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340),
                           (size_t)in_stack_fffffffffffff338,in_stack_fffffffffffff330.m_bits,
                           (SVInt *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
                local_c8 = boost::unordered::detail::foa::
                           table<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                           ::make_iterator((locator *)0x3ebcef);
                local_e1[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                            *)&stack0xfffffffffffff6a8,&local_c8,local_e1);
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
                ::unchecked_emplace_with_rehash<slang::SVInt&>
                          ((table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                            *)SVar11.startLoc,(size_t)SVar11.endLoc,
                           (SVInt *)in_stack_fffffffffffff380);
                local_f8 = boost::unordered::detail::foa::
                           table<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                           ::make_iterator((locator *)0x3ebd5a);
                local_111[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                            *)&stack0xfffffffffffff6a8,&local_f8,local_111);
              }
              if ((in_stack_fffffffffffff6b8 & 1U) == 0) {
                SVar11 = parsing::Token::range
                                   ((Token *)CONCAT17(in_stack_fffffffffffff347,
                                                      in_stack_fffffffffffff340));
                sourceRange_02.startLoc._7_1_ = in_stack_fffffffffffff347;
                sourceRange_02.startLoc._0_7_ = in_stack_fffffffffffff340;
                sourceRange_02.endLoc = in_stack_fffffffffffff348;
                in_stack_fffffffffffff380 =
                     (EvalContext *)
                     ASTContext::addDiag(in_stack_fffffffffffff338,
                                         SUB84((ulong)in_stack_fffffffffffff350 >> 0x20,0),
                                         sourceRange_02);
                Diagnostic::operator<<
                          ((Diagnostic *)in_stack_fffffffffffff320,
                           (ConstantValue *)in_stack_fffffffffffff318);
                local_350 = 3;
              }
              else {
                Expression::eval((Expression *)
                                 CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328),
                                 (EvalContext *)in_stack_fffffffffffff320);
                bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x3ebe5c);
                slang::ConstantValue::~ConstantValue((ConstantValue *)0x3ebe79);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  pSVar7 = slang::ConstantValue::integer((ConstantValue *)0x3ebec6);
                  bVar1 = SVInt::hasUnknown(pSVar7);
                  DVar13 = SUB84((ulong)in_stack_fffffffffffff350 >> 0x20,0);
                  if (bVar1) {
                    SVar12 = parsing::Token::range
                                       ((Token *)CONCAT17(in_stack_fffffffffffff347,
                                                          in_stack_fffffffffffff340));
                    in_stack_fffffffffffff358 = SVar12.endLoc;
                    sourceRange_03.startLoc._7_1_ = in_stack_fffffffffffff347;
                    sourceRange_03.startLoc._0_7_ = in_stack_fffffffffffff340;
                    sourceRange_03.endLoc = in_stack_fffffffffffff348;
                    in_stack_fffffffffffff350 =
                         ASTContext::addDiag(in_stack_fffffffffffff338,DVar13,sourceRange_03);
                    Diagnostic::operator<<
                              ((Diagnostic *)in_stack_fffffffffffff320,
                               (ConstantValue *)in_stack_fffffffffffff318);
                    local_350 = 3;
                  }
                  else {
                    local_350 = 0;
                  }
                }
                else {
                  local_350 = 3;
                }
              }
            }
            slang::ConstantValue::~ConstantValue((ConstantValue *)0x3ebf8c);
          } while (local_350 == 0);
          bVar1 = SmallVectorBase<slang::SVInt>::empty(local_900);
          if (bVar1) {
            Expression::eval((Expression *)
                             CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328),
                             (EvalContext *)in_stack_fffffffffffff320);
            slang::ConstantValue::~ConstantValue((ConstantValue *)0x3ebff1);
          }
          EvalContext::reportAllDiags((EvalContext *)in_stack_fffffffffffff320);
          isUninstantiated_00 = (undefined1)((ulong)in_stack_fffffffffffff3f0 >> 0x38);
          src = extraout_RDX;
          if ((local_198->valid & 1U) != 0) {
            not_null<const_slang::ast::Scope_*>::operator->
                      ((not_null<const_slang::ast::Scope_*> *)0x3ec022);
            Scope::isUninstantiated((Scope *)in_stack_fffffffffffff358);
            local_9f0 = SmallVectorBase<slang::SVInt>::begin(local_900);
            pSVar8 = SmallVectorBase<slang::SVInt>::end(local_900);
            src = extraout_RDX_00;
            for (; isUninstantiated_00 = (undefined1)((ulong)in_stack_fffffffffffff3f0 >> 0x38),
                local_9f0 != pSVar8; local_9f0 = local_9f0 + 1) {
              slang::ConstantValue::ConstantValue
                        ((ConstantValue *)in_stack_fffffffffffff320,
                         (SVInt *)in_stack_fffffffffffff318);
              fromSyntax::anon_class_48_6_985204b5::operator()
                        ((anon_class_48_6_985204b5 *)
                         CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff406,
                                                 CONCAT15(in_stack_fffffffffffff405,
                                                          in_stack_fffffffffffff400))),
                         in_stack_fffffffffffff3f8,SUB81((ulong)in_stack_fffffffffffff3f0 >> 0x38,0)
                        );
              slang::ConstantValue::~ConstantValue((ConstantValue *)0x3ec0ec);
              src = extraout_RDX_01;
            }
          }
          SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::copy
                    (local_2c0,(EVP_PKEY_CTX *)local_148,src);
          this_00 = this;
          std::span<const_slang::ast::GenerateBlockSymbol_*const,_18446744073709551615UL>::
          span<const_slang::ast::GenerateBlockSymbol_*,_18446744073709551615UL>
                    (this,(span<const_slang::ast::GenerateBlockSymbol_*,_18446744073709551615UL> *)
                          CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
          (local_198->entries)._M_ptr = local_a38;
          (local_198->entries)._M_extent._M_extent_value = local_a30;
          bVar1 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::empty(local_2c0);
          if (bVar1) {
            SVInt::SVInt((SVInt *)this_00,in_stack_fffffffffffff32c,
                         (uint64_t)in_stack_fffffffffffff320,in_stack_fffffffffffff318._7_1_);
            slang::ConstantValue::ConstantValue
                      ((ConstantValue *)in_stack_fffffffffffff320,(SVInt *)in_stack_fffffffffffff318
                      );
            fromSyntax::anon_class_48_6_985204b5::operator()
                      ((anon_class_48_6_985204b5 *)
                       CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff406,
                                               CONCAT15(in_stack_fffffffffffff405,
                                                        in_stack_fffffffffffff400))),
                       in_stack_fffffffffffff3f8,(bool)isUninstantiated_00);
            slang::ConstantValue::~ConstantValue((ConstantValue *)0x3ec213);
            SVInt::~SVInt((SVInt *)this_00);
          }
          else {
            local_a90 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::begin(local_2c0);
            ppGVar9 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::end(local_2c0);
            for (; local_a90 != ppGVar9; local_a90 = local_a90 + 1) {
              Scope::addMember((Scope *)in_stack_fffffffffffff320,
                               (Symbol *)in_stack_fffffffffffff318);
            }
          }
LAB_003ec31d:
          local_350 = 1;
          local_140 = local_198;
          SmallVector<slang::SVInt,_8UL>::~SmallVector((SmallVector<slang::SVInt,_8UL> *)0x3ec32a);
          SmallSet<slang::SVInt,_8UL,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
          ::~SmallSet((SmallSet<slang::SVInt,_8UL,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                       *)0x3ec337);
          EvalContext::~EvalContext((EvalContext *)in_stack_fffffffffffff320);
        }
        else {
          local_140 = local_198;
          local_350 = 1;
        }
        goto LAB_003ec36f;
      }
    }
    local_140 = local_198;
    local_350 = 1;
  }
  else {
    local_140 = local_198;
    local_350 = 1;
  }
LAB_003ec36f:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x3ec37c);
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> *)0x3ec389);
  return local_140;
}

Assistant:

GenerateBlockArraySymbol& GenerateBlockArraySymbol::fromSyntax(Compilation& comp,
                                                               const LoopGenerateSyntax& syntax,
                                                               SymbolIndex scopeIndex,
                                                               const ASTContext& context,
                                                               uint32_t constructIndex) {
    auto [name, loc] = getGenerateBlockName(*syntax.block);
    auto result = comp.emplace<GenerateBlockArraySymbol>(comp, name, loc, constructIndex);
    result->setSyntax(syntax);
    result->setAttributes(*context.scope, syntax.attributes);

    auto genvar = syntax.identifier;
    if (genvar.isMissing())
        return *result;

    auto genvarSyntax = comp.emplace<IdentifierNameSyntax>(genvar);

    // Walk up the tree a bit to see if we're nested inside another generate loop.
    // If we are, we'll include that parent's array size in our decision about
    // wether we've looped too many times within one generate block.
    const uint64_t baseCount = getGenerateLoopCount(*context.scope);
    const uint64_t loopLimit = comp.getOptions().maxGenerateSteps;

    // If the loop initializer has a `genvar` keyword, we can use the name directly
    // Otherwise we need to do a lookup to make sure we have the actual genvar somewhere.
    if (!syntax.genvar) {
        auto symbol = Lookup::unqualifiedAt(*context.scope, genvar.valueText(),
                                            context.getLocation(), genvar.range());
        if (!symbol)
            return *result;

        if (symbol->kind != SymbolKind::Genvar) {
            auto& diag = context.addDiag(diag::NotAGenvar, genvar.range());
            diag << genvar.valueText();
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return *result;
        }

        comp.noteReference(*symbol);
    }
    else {
        // Fabricate a genvar symbol to live in this array since it was declared inline.
        auto genvarSymbol = comp.emplace<GenvarSymbol>(genvar.valueText(), genvar.location());
        genvarSymbol->setSyntax(*genvarSyntax);
        result->addMember(*genvarSymbol);
    }

    SmallVector<const GenerateBlockSymbol*> entries;
    auto createBlock = [&, blockLoc = loc](ConstantValue value, bool isUninstantiated) {
        // Spec: each generate block gets their own scope, with an implicit
        // localparam of the same name as the genvar.
        auto block = comp.emplace<GenerateBlockSymbol>(comp, "", blockLoc, (uint32_t)entries.size(),
                                                       isUninstantiated);
        auto implicitParam = comp.emplace<ParameterSymbol>(genvar.valueText(), genvar.location(),
                                                           true /* isLocal */, false /* isPort */);
        implicitParam->setSyntax(*genvarSyntax);
        comp.noteReference(*implicitParam);

        block->addMember(*implicitParam);
        block->setSyntax(*syntax.block);

        addBlockMembers(*block, *syntax.block);

        implicitParam->setType(comp.getIntegerType());
        implicitParam->setValue(comp, std::move(value), /* needsCoercion */ false);
        implicitParam->setIsFromGenvar(true);

        block->arrayIndex = &implicitParam->getValue().integer();
        entries.push_back(block);
    };

    // Bind the initialization expression.
    auto& initial = Expression::bindRValue(comp.getIntegerType(), *syntax.initialExpr,
                                           syntax.equals.range(), context);
    ConstantValue initialVal = context.eval(initial);
    if (!initialVal)
        return *result;

    // Fabricate a local variable that will serve as the loop iteration variable.
    auto& iterScope = *comp.emplace<StatementBlockSymbol>(comp, "", loc,
                                                          StatementBlockKind::Sequential,
                                                          VariableLifetime::Automatic);
    auto& local = *comp.emplace<VariableSymbol>(genvar.valueText(), genvar.location(),
                                                VariableLifetime::Automatic);
    local.setType(comp.getIntegerType());
    local.flags |= VariableFlags::CompilerGenerated;

    iterScope.setTemporaryParent(*context.scope, scopeIndex);
    iterScope.addMember(local);

    // Bind the stop and iteration expressions so we can reuse them on each iteration.
    ASTContext iterContext(iterScope, LookupLocation::max);
    auto& stopExpr = Expression::bind(*syntax.stopExpr, iterContext);
    auto& iterExpr = Expression::bind(*syntax.iterationExpr, iterContext,
                                      ASTFlags::AssignmentAllowed);
    if (stopExpr.bad() || iterExpr.bad())
        return *result;

    if (!context.requireBooleanConvertible(stopExpr))
        return *result;

    // Create storage for the iteration variable.
    EvalContext evalContext(iterContext);
    evalContext.pushEmptyFrame();

    auto loopVal = evalContext.createLocal(&local, initialVal);
    if (loopVal->integer().hasUnknown())
        iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;

    // Generate blocks! In the first pass we evaluate all indices for correctness,
    // letting us enforce the loop limit to detect infinite loops before trying
    // to generate more hierarchy.
    uint64_t loopCount = 0;
    SmallSet<SVInt, 8> usedValues;
    SmallVector<SVInt, 8> indices;
    while (true) {
        loopCount += baseCount;
        if (loopCount > loopLimit) {
            context.addDiag(diag::MaxGenerateStepsExceeded, syntax.keyword.range());
            return *result;
        }

        auto stop = stopExpr.eval(evalContext);
        if (stop.bad() || !stop.isTrue()) {
            result->valid = !stop.bad();
            break;
        }

        indices.emplace_back(loopVal->integer());
        auto pair = usedValues.emplace(loopVal->integer());
        if (!pair.second) {
            iterContext.addDiag(diag::GenvarDuplicate, genvar.range()) << *loopVal;
            break;
        }

        if (!iterExpr.eval(evalContext))
            break;

        if (loopVal->integer().hasUnknown()) {
            iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;
            break;
        }
    }

    // If we never ran the iteration expression, run it once to ensure
    // we've collected all errors.
    if (indices.empty())
        iterExpr.eval(evalContext);

    evalContext.reportAllDiags();

    // If the generate loop completed successfully, go through and create blocks.
    if (result->valid) {
        bool isUninstantiated = context.scope->isUninstantiated();
        for (auto& index : indices)
            createBlock(index, isUninstantiated);
    }

    result->entries = entries.copy(comp);
    if (entries.empty()) {
        createBlock(SVInt(32, 0, true), true);
    }
    else {
        for (auto entry : entries)
            result->addMember(*entry);
    }

    return *result;
}